

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iffl_list.h
# Opt level: O0

const_iterator __thiscall
iffl::
flat_forward_list_ref<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
::end(flat_forward_list_ref<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
      *this)

{
  pointer_type pcVar1;
  buffer_type *pbVar2;
  size_t sVar3;
  flat_forward_list_ref<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
  *in_RSI;
  size_with_padding<8UL> local_28;
  size_with_padding_t last_element_size;
  size_type next_offset;
  flat_forward_list_ref<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
  *this_local;
  
  validate_pointer_invariants(in_RSI);
  pbVar2 = buff(in_RSI);
  if (pbVar2->last == (pointer_type)0x0) {
    memset(this,0,8);
    flat_forward_list_iterator_t<const__FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
    ::flat_forward_list_iterator_t
              ((flat_forward_list_iterator_t<const__FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
                *)this);
  }
  else {
    pbVar2 = buff(in_RSI);
    last_element_size.size =
         flat_forward_list_traits_traits<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
         ::get_next_offset(pbVar2->last);
    if (last_element_size.size == 0) {
      pbVar2 = buff(in_RSI);
      local_28.size =
           (size_t)flat_forward_list_traits_traits<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
                   ::get_size(pbVar2->last);
      pbVar2 = buff(in_RSI);
      pcVar1 = pbVar2->last;
      sVar3 = size_with_padding<8UL>::size_padded(&local_28);
      flat_forward_list_iterator_t<const__FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
      ::flat_forward_list_iterator_t
                ((flat_forward_list_iterator_t<const__FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
                  *)this,pcVar1 + sVar3);
    }
    else {
      pbVar2 = buff(in_RSI);
      flat_forward_list_iterator_t<const__FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
      ::flat_forward_list_iterator_t
                ((flat_forward_list_iterator_t<const__FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
                  *)this,pbVar2->last + last_element_size.size);
    }
  }
  return (const_iterator)(buffer_char_pointer)this;
}

Assistant:

const_iterator end() const noexcept {
        validate_pointer_invariants();
        if (buff().last) {
            if (traits_traits::has_next_offset_v) {
                size_type const next_offset{ traits_traits::get_next_offset(buff().last) };
                if (next_offset) {
                    return const_iterator{ buff().last + next_offset };
                } else {
                    size_with_padding_t const last_element_size{ traits_traits::get_size(buff().last) };
                    return const_iterator{ buff().last + last_element_size.size_padded() };
                }
            } else {
                size_with_padding_t const last_element_size{ traits_traits::get_size(buff().last) };
                return const_iterator{ buff().last + last_element_size.size_padded() };
            }
        } else {
            return const_iterator{ };
        }
    }